

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O0

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::extract(mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
          *this,demand_t *dest,duration_t empty_queue_timeout)

{
  anon_class_16_2_0c77c6cc __p;
  anon_class_16_2_0c77c6cc __p_00;
  bool bVar1;
  anon_class_8_1_8991fb9c_for_m_lambda local_60;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_h_mchain_details_hpp:442:9)>
  local_58;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_h_mchain_details_hpp:442:9)>
  decrement_threads;
  anon_class_16_2_0c77c6cc predicate;
  undefined1 local_38 [7];
  bool queue_empty;
  unique_lock<std::mutex> lock;
  demand_t *dest_local;
  mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *this_local;
  duration_t empty_queue_timeout_local;
  
  lock._8_8_ = dest;
  this_local = (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
                *)empty_queue_timeout.__r;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->m_lock);
  predicate.queue_empty._7_1_ = details::unlimited_demand_queue::is_empty(&this->m_queue);
  if ((bool)predicate.queue_empty._7_1_) {
    if (this->m_status == closed) {
      empty_queue_timeout_local.__r._4_4_ = chain_closed;
      goto LAB_00483c6c;
    }
    predicate.this =
         (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
          *)((long)&predicate.queue_empty + 7);
    this->m_threads_to_wakeup = this->m_threads_to_wakeup + 1;
    local_60.this = this;
    decrement_threads.m_lambda.this =
         (anon_class_8_1_8991fb9c_for_m_lambda_conflict4)
         (anon_class_8_1_8991fb9c_for_m_lambda_conflict4)this;
    so_5::details::
    at_scope_exit<so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::extract(so_5::mchain_props::demand_t&,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_2_>
              ((details *)&local_58,&local_60);
    bVar1 = details::is_infinite_wait_timevalue((duration_t)this_local);
    if (bVar1) {
      __p.queue_empty = (bool *)predicate.this;
      __p.this = (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
                  *)decrement_threads.m_lambda.this;
      std::condition_variable::
      wait<so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::extract(so_5::mchain_props::demand_t&,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_>
                (&this->m_underflow_cond,(unique_lock<std::mutex> *)local_38,__p);
    }
    else {
      __p_00.queue_empty = (bool *)predicate.this;
      __p_00.this = (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
                     *)decrement_threads.m_lambda.this;
      std::condition_variable::
      wait_for<long,std::ratio<1l,1000000000l>,so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::extract(so_5::mchain_props::demand_t&,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_>
                (&this->m_underflow_cond,(unique_lock<std::mutex> *)local_38,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local,__p_00);
    }
    so_5::details::scope_exit_details::
    at_exit_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/h/mchain_details.hpp:442:9)>
    ::~at_exit_t(&local_58);
  }
  if ((predicate.queue_empty._7_1_ & 1) == 0) {
    empty_queue_timeout_local.__r._4_4_ =
         extract_demand_from_not_empty_queue(this,(demand_t *)lock._8_8_);
  }
  else {
    empty_queue_timeout_local.__r._4_4_ = chain_closed;
    if (this->m_status == open) {
      empty_queue_timeout_local.__r._4_4_ = no_messages;
    }
  }
LAB_00483c6c:
  predicate.queue_empty._0_4_ = 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return empty_queue_timeout_local.__r._4_4_;
}

Assistant:

virtual extraction_status_t
		extract(
			demand_t & dest,
			duration_t empty_queue_timeout ) override
			{
				std::unique_lock< std::mutex > lock{ m_lock };

				// If queue is empty we must wait for some time.
				bool queue_empty = m_queue.is_empty();
				if( queue_empty )
					{
						if( details::status::closed == m_status )
							// Waiting for new messages has no sence because
							// chain is closed.
							return extraction_status_t::chain_closed;

						auto predicate = [this, &queue_empty]() -> bool {
								queue_empty = m_queue.is_empty();
								return !queue_empty ||
										details::status::closed == m_status;
							};

						// Count of sleeping thread must be incremented before
						// going to sleep and decremented right after.
						++m_threads_to_wakeup;
						auto decrement_threads = so_5::details::at_scope_exit(
								[this] { --m_threads_to_wakeup; } );

						if( !details::is_infinite_wait_timevalue( empty_queue_timeout ) )
							// A wait with finite timeout must be performed.
							m_underflow_cond.wait_for(
									lock, empty_queue_timeout, predicate );
						else
							// Wait until arrival of any message or closing of chain.
							m_underflow_cond.wait( lock, predicate );
					}

				// If queue is still empty nothing can be extracted and
				// we must stop operation.
				if( queue_empty )
					return details::status::open == m_status ?
							// The chain is still open so there must be this result
							extraction_status_t::no_messages :
							// The chain is closed and there must be different result
							extraction_status_t::chain_closed;

				return extract_demand_from_not_empty_queue( dest );
			}